

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O0

QRect __thiscall QMenuPrivate::rect(QMenuPrivate *this)

{
  int xp2;
  int yp2;
  QRect *this_00;
  QStyle *pQVar1;
  QMenuPrivate *in_RDI;
  long in_FS_OFFSET;
  QRect QVar2;
  int fw;
  int vmargin;
  int hmargin;
  QStyle *style;
  QMenu *q;
  QStyleOption opt;
  QWidget *in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  QStyleOption *in_stack_ffffffffffffff68;
  undefined1 *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  undefined1 *puStack_30;
  undefined1 *local_28;
  undefined1 *puStack_20;
  undefined1 *local_18;
  undefined1 *puStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QRect *)q_func(in_RDI);
  pQVar1 = QWidget::style(in_stack_ffffffffffffff48);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_10 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  QStyleOption::QStyleOption
            (in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,in_stack_ffffffffffffff60);
  QStyleOption::initFrom
            (in_stack_ffffffffffffff68,
             (QWidget *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  xp2 = (**(code **)(*(long *)pQVar1 + 0xe0))(pQVar1,0x1c,&local_48,this_00);
  yp2 = (**(code **)(*(long *)pQVar1 + 0xe0))(pQVar1,0x1d,&local_48,this_00);
  (**(code **)(*(long *)pQVar1 + 0xe0))(pQVar1,0x1e,&local_48,this_00);
  QWidget::rect((QWidget *)in_stack_ffffffffffffff68);
  QVar2 = QRect::adjusted(this_00,(int)((ulong)pQVar1 >> 0x20),(int)pQVar1,xp2,yp2);
  QStyleOption::~QStyleOption((QStyleOption *)in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return QVar2;
  }
  __stack_chk_fail();
}

Assistant:

QRect QMenuPrivate::rect() const
{
    Q_Q(const QMenu);
    QStyle *style = q->style();
    QStyleOption opt(0);
    opt.initFrom(q);
    const int hmargin = style->pixelMetric(QStyle::PM_MenuHMargin, &opt, q);
    const int vmargin = style->pixelMetric(QStyle::PM_MenuVMargin, &opt, q);
    const int fw = style->pixelMetric(QStyle::PM_MenuPanelWidth, &opt, q);
    return (q->rect().adjusted(hmargin + fw + leftmargin, vmargin + fw + topmargin,
                               -(hmargin + fw + rightmargin), -(vmargin + fw + bottommargin)));
}